

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void uWS::WebSocketHandshake::Sha1Loop<4>::f<18>(uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[2] ^ b[7] ^ b[0xc] ^ b[10];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[10] = uVar2;
  uVar1 = a[1];
  a[3] = a[3] + (a[2] << 5 | a[2] >> 0x1b) + uVar2 + (*a & uVar1 | (*a | uVar1) & a[4]) + 0x8f1bbcdc
  ;
  a[1] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}